

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool re2::RE2::Replace(string *str,RE2 *re,StringPiece *rewrite)

{
  int endpos;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  string s;
  StringPiece vec [17];
  string local_168;
  StringPiece local_148 [17];
  
  lVar5 = 8;
  do {
    *(undefined8 *)((long)local_148 + lVar5 + -8) = 0;
    *(undefined4 *)((long)&local_148[0].ptr_ + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x118);
  uVar4 = MaxSubmatch(rewrite);
  if (uVar4 < 0x11) {
    local_168._M_dataplus._M_p = (str->_M_dataplus)._M_p;
    endpos = (int)str->_M_string_length;
    local_168._M_string_length = CONCAT44(local_168._M_string_length._4_4_,endpos);
    bVar3 = false;
    bVar2 = Match(re,(StringPiece *)&local_168,0,endpos,UNANCHORED,local_148,uVar4 + 1);
    if (bVar2) {
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      bVar3 = Rewrite(re,&local_168,rewrite,local_148,uVar4 + 1);
      if (bVar3) {
        pcVar1 = (str->_M_dataplus)._M_p;
        if (local_148[0].ptr_ < pcVar1) {
          __assert_fail("vec[0].begin() >= str->data()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                        ,0x177,
                        "static bool re2::RE2::Replace(string *, const RE2 &, const StringPiece &)")
          ;
        }
        if (pcVar1 + str->_M_string_length < local_148[0].ptr_ + local_148[0].length_) {
          __assert_fail("vec[0].end() <= str->data()+str->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                        ,0x178,
                        "static bool re2::RE2::Replace(string *, const RE2 &, const StringPiece &)")
          ;
        }
        std::__cxx11::string::replace
                  ((ulong)str,(long)local_148[0].ptr_ - (long)pcVar1,
                   (char *)(long)local_148[0].length_,(ulong)local_168._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool RE2::Replace(string *str,
                 const RE2& re,
                 const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;
  if (!re.Match(*str, 0, static_cast<int>(str->size()), UNANCHORED, vec, nvec))
    return false;

  string s;
  if (!re.Rewrite(&s, rewrite, vec, nvec))
    return false;

  assert(vec[0].begin() >= str->data());
  assert(vec[0].end() <= str->data()+str->size());
  str->replace(vec[0].data() - str->data(), vec[0].size(), s);
  return true;
}